

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

string * __thiscall
Hospital::Getter_Password_abi_cxx11_(string *__return_storage_ptr__,Hospital *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->Admin_Password)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->Admin_Password)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string Hospital ::Getter_Password(){
    return Admin_Password;
}